

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uefitool.cpp
# Opt level: O3

void __thiscall UEFITool::dropEvent(UEFITool *this,QDropEvent *event)

{
  QString path;
  QString local_58;
  QArrayData *local_40;
  char16_t *local_38;
  qsizetype qStack_30;
  QArrayDataPointer<QUrl> local_28;
  
  QMimeData::urls();
  QUrl::toLocalFile();
  QArrayDataPointer<QUrl>::~QArrayDataPointer(&local_28);
  local_58.d.d = (Data *)local_40;
  local_58.d.ptr = local_38;
  local_58.d.size = qStack_30;
  if (local_40 != (QArrayData *)0x0) {
    LOCK();
    (local_40->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_40->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  openImageFile(this,&local_58);
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,8);
    }
  }
  if (local_40 != (QArrayData *)0x0) {
    LOCK();
    (local_40->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_40->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_40->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_40,2,8);
    }
  }
  return;
}

Assistant:

void UEFITool::dropEvent(QDropEvent* event)
{
    QString path = event->mimeData()->urls().at(0).toLocalFile();
    openImageFile(path);
}